

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O2

DdNode * Extra_bddCreateOr(DdManager *dd,int nVars)

{
  DdNode *n;
  DdNode *pDVar1;
  int i;
  
  n = Cudd_ReadLogicZero(dd);
  Cudd_Ref(n);
  i = 0;
  if (nVars < 1) {
    nVars = i;
  }
  for (; nVars != i; i = i + 1) {
    pDVar1 = Cudd_bddIthVar(dd,i);
    pDVar1 = Cudd_bddOr(dd,n,pDVar1);
    Cudd_Ref(pDVar1);
    Cudd_RecursiveDeref(dd,n);
    n = pDVar1;
  }
  Cudd_Deref(n);
  return n;
}

Assistant:

DdNode * Extra_bddCreateOr( DdManager * dd, int nVars )
{
    DdNode * bFunc, * bTemp;
    int i;
    bFunc = Cudd_ReadLogicZero(dd); Cudd_Ref( bFunc );
    for ( i = 0; i < nVars; i++ )
    {
        bFunc = Cudd_bddOr( dd, bTemp = bFunc, Cudd_bddIthVar(dd,i) );  Cudd_Ref( bFunc );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bFunc );
    return bFunc;
}